

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::RNEMD::writeOutputFile(RNEMD *this)

{
  RealType RVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ostream *poVar9;
  size_t sVar10;
  reference pvVar11;
  pointer pBVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined4 extraout_var_01;
  reference pvVar15;
  allocator_type *paVar16;
  reference *this_00;
  reference *prVar17;
  long in_RDI;
  RealType RVar18;
  string message_1;
  uint i_3;
  uint bin_2;
  string message;
  uint i_2;
  uint bin_1;
  uint bin;
  uint i_1;
  int numberOfAccumulators;
  vector<int,_std::allocator<int>_> nonEmptyAccumulators;
  uint type;
  uint i;
  RealType Jpart;
  Vector3d JzL;
  Vector3d JzP;
  RealType Jz;
  RealType avgArea;
  RealType time;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  byte in_stack_fffffffffffffcff;
  allocator_type *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  ostream *in_stack_fffffffffffffd38;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  reference local_1e8;
  uint local_1d8;
  uint local_1d4;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  reference local_150;
  uint local_13c;
  uint local_138;
  uint local_134;
  reference local_130;
  uint local_11c;
  int local_118;
  undefined1 local_111 [41];
  string local_e8 [36];
  uint local_c4;
  type_index local_c0;
  undefined8 local_b8;
  type_index local_b0;
  undefined8 local_a8;
  reference local_a0;
  uint local_8c;
  double local_58;
  double local_20;
  RealType local_18;
  RealType local_10;
  
  if (((*(byte *)(in_RDI + 0x288) & 1) != 0) && ((*(byte *)(in_RDI + 0x1c60) & 1) != 0)) {
    _Var4 = std::__cxx11::string::c_str();
    std::operator|(_S_out,_S_trunc);
    std::ofstream::open((char *)(in_RDI + 0x1ce8),_Var4);
    uVar7 = std::ios::operator!((ios *)(in_RDI + 0x1ce8 +
                                       *(long *)(*(long *)(in_RDI + 0x1ce8) + -0x18)));
    if ((uVar7 & 1) != 0) {
      uVar8 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Could not open \"%s\" for RNEMD output.\n",uVar8);
      painCave.isFatal = 1;
      simError();
    }
    local_10 = Snapshot::getTime(*(Snapshot **)(in_RDI + 0x10));
    local_18 = Utils::Accumulator<double>::getAverage((Accumulator<double> *)(in_RDI + 0x1f50));
    local_20 = 0.0;
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffcf0,
               (Vector3<double> *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffcf0,
               (Vector3<double> *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    RVar1 = local_10;
    local_58 = 0.0;
    SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
    RVar18 = Globals::getDt((Globals *)0x344167);
    if (RVar18 <= RVar1) {
      local_20 = (*(double *)(in_RDI + 0x2e8) / (local_10 * local_18)) / 0.0004184;
      operator/((Vector<double,_3U> *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                (double)in_stack_fffffffffffffcf0);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                 (Vector<double,_3U> *)in_stack_fffffffffffffcf0);
      operator/((Vector<double,_3U> *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                (double)in_stack_fffffffffffffcf0);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                 (Vector<double,_3U> *)in_stack_fffffffffffffcf0);
      local_58 = *(double *)(in_RDI + 0x2f0) / (local_10 * local_18);
    }
    std::operator<<((ostream *)(in_RDI + 0x1ce8),
                    "#######################################################\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"# RNEMD {\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#    exchangeMethod  = \"");
    poVar9 = std::operator<<(poVar9,(string *)(in_RDI + 0x268));
    std::operator<<(poVar9,"\";\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#    fluxType  = \"");
    poVar9 = std::operator<<(poVar9,(string *)(in_RDI + 0x248));
    std::operator<<(poVar9,"\";\n");
    if ((*(byte *)(in_RDI + 0x289) & 1) != 0) {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#    privilegedAxis = ");
      poVar9 = std::operator<<(poVar9,(string *)(in_RDI + 0x338));
      std::operator<<(poVar9,";\n");
    }
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#    exchangeTime = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x1cb0));
    std::operator<<(poVar9,";\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#    objectSelection = \"");
    poVar9 = std::operator<<(poVar9,(string *)(in_RDI + 0x68));
    std::operator<<(poVar9,"\";\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#    selectionA = \"");
    poVar9 = std::operator<<(poVar9,(string *)(in_RDI + 0x970));
    std::operator<<(poVar9,"\";\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#    selectionB = \"");
    poVar9 = std::operator<<(poVar9,(string *)(in_RDI + 0x990));
    std::operator<<(poVar9,"\";\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#    outputSelection = \"");
    poVar9 = std::operator<<(poVar9,(string *)(in_RDI + 0x15e8));
    std::operator<<(poVar9,"\";\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"# }\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),
                    "#######################################################\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"# RNEMD report:\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#      running time = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_10);
    std::operator<<(poVar9," fs\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"# Target flux:\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#           kinetic = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x1c70) / 0.0004184);
    std::operator<<(poVar9," (kcal/mol/A^2/fs)\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          momentum = ");
    poVar9 = OpenMD::operator<<((ostream *)in_stack_fffffffffffffd00,
                                (Vector<double,_3U> *)
                                CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::operator<<(poVar9," (amu/A/fs^2)\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"#  angular momentum = ");
    poVar9 = OpenMD::operator<<((ostream *)in_stack_fffffffffffffd00,
                                (Vector<double,_3U> *)
                                CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::operator<<(poVar9," (amu/A^2/fs^2)\n");
    if ((*(byte *)(in_RDI + 0x28a) & 1) == 0) {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          particle = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x1c78));
      std::operator<<(poVar9," (particles/A^2/fs)\n");
    }
    else {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#   current density = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x1c78));
      std::operator<<(poVar9," (electrons/A^2/fs)\n");
    }
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"# Target one-time exchanges:\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          kinetic = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x2a8) / 0.0004184);
    std::operator<<(poVar9," (kcal/mol)\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          momentum = ");
    poVar9 = OpenMD::operator<<((ostream *)in_stack_fffffffffffffd00,
                                (Vector<double,_3U> *)
                                CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::operator<<(poVar9," (amu*A/fs)\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"#  angular momentum = ");
    poVar9 = OpenMD::operator<<((ostream *)in_stack_fffffffffffffd00,
                                (Vector<double,_3U> *)
                                CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::operator<<(poVar9," (amu*A^2/fs)\n");
    if ((*(byte *)(in_RDI + 0x28a) & 1) == 0) {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          particle = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x2b0));
      std::operator<<(poVar9," (particles)\n");
    }
    else {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#   current density = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x2b0));
      std::operator<<(poVar9," (electrons)\n");
    }
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"# Actual exchange totals:\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          kinetic = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x2e8) / 0.0004184);
    std::operator<<(poVar9," (kcal/mol)\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          momentum = ");
    poVar9 = OpenMD::operator<<((ostream *)in_stack_fffffffffffffd00,
                                (Vector<double,_3U> *)
                                CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::operator<<(poVar9," (amu*A/fs)\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"#  angular momentum = ");
    poVar9 = OpenMD::operator<<((ostream *)in_stack_fffffffffffffd00,
                                (Vector<double,_3U> *)
                                CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::operator<<(poVar9," (amu*A^2/fs)\n");
    if ((*(byte *)(in_RDI + 0x28a) & 1) == 0) {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          particle = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x2f0));
      std::operator<<(poVar9," (particles)\n");
    }
    else {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#   current density = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(double *)(in_RDI + 0x2f0));
      std::operator<<(poVar9," (electrons)\n");
    }
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"# Actual flux:\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          kinetic = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_20);
    std::operator<<(poVar9," (kcal/mol/A^2/fs)\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          momentum = ");
    poVar9 = OpenMD::operator<<((ostream *)in_stack_fffffffffffffd00,
                                (Vector<double,_3U> *)
                                CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::operator<<(poVar9," (amu/A/fs^2)\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"#  angular momentum = ");
    poVar9 = OpenMD::operator<<((ostream *)in_stack_fffffffffffffd00,
                                (Vector<double,_3U> *)
                                CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::operator<<(poVar9," (amu/A^2/fs^2)\n");
    if ((*(byte *)(in_RDI + 0x28a) & 1) == 0) {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#          particle = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_58);
      std::operator<<(poVar9," (particles/A^2/fs)\n");
    }
    else {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#   current density = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_58);
      std::operator<<(poVar9," (electrons/A^2/fs)\n");
    }
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"# Exchange statistics:\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#               attempted = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(uint *)(in_RDI + 0x328));
    std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#                  failed = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(uint *)(in_RDI + 0x32c));
    std::operator<<(poVar9,"\n");
    bVar2 = std::operator==(in_stack_fffffffffffffcf0,
                            (char *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    if (bVar2) {
      poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"#  NIVS root-check errors = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(uint *)(in_RDI + 0x330));
      std::operator<<(poVar9,"\n");
    }
    std::operator<<((ostream *)(in_RDI + 0x1ce8),
                    "#######################################################\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),"#");
    for (local_8c = 0; uVar7 = (ulong)local_8c,
        sVar10 = std::bitset<9UL>::size((bitset<9UL> *)(in_RDI + 0x1ee8)), uVar7 < sVar10;
        local_8c = local_8c + 1) {
      std::bitset<9UL>::operator[]
                ((bitset<9UL> *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                 (size_t)in_stack_fffffffffffffcf0);
      bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffcf0);
      std::bitset<9UL>::reference::~reference(&local_a0);
      if (bVar2) {
        poVar9 = std::operator<<((ostream *)(in_RDI + 0x1ce8),"\t");
        pvVar11 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),(ulong)local_8c);
        poVar9 = std::operator<<(poVar9,(string *)pvVar11);
        poVar9 = std::operator<<(poVar9,"(");
        pvVar11 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),(ulong)local_8c);
        poVar9 = std::operator<<(poVar9,(string *)&pvVar11->units);
        std::operator<<(poVar9,")");
        pvVar11 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),(ulong)local_8c);
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&pvVar11->accumulator,0);
        pBVar12 = std::
                  unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                  ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                *)0x344db1);
        iVar5 = (*pBVar12->_vptr_BaseAccumulator[7])();
        local_a8 = CONCAT44(extraout_var,iVar5);
        std::type_index::type_index(&local_b0,(type_info *)&Vector3<double>::typeinfo);
        bVar2 = std::type_index::operator==
                          ((type_index *)in_stack_fffffffffffffcf0,
                           (type_index *)
                           CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
        if (bVar2) {
          std::operator<<((ostream *)(in_RDI + 0x1ce8),"\t\t");
        }
        pvVar11 = std::
                  vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                  ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                *)(in_RDI + 0x1f20),(ulong)local_8c);
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&pvVar11->accumulator,0);
        pBVar12 = std::
                  unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                  ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                *)0x344e41);
        iVar5 = (*pBVar12->_vptr_BaseAccumulator[7])();
        local_b8 = CONCAT44(extraout_var_00,iVar5);
        std::type_index::type_index
                  (&local_c0,(type_info *)&std::vector<double,std::allocator<double>>::typeinfo);
        bVar2 = std::type_index::operator==
                          ((type_index *)in_stack_fffffffffffffcf0,
                           (type_index *)
                           CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
        if (bVar2) {
          std::operator<<((ostream *)(in_RDI + 0x1ce8),"(");
          for (local_c4 = 0; uVar7 = (ulong)local_c4,
              sVar13 = std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size
                                 ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *
                                  )(in_RDI + 0x1f38)), uVar7 < sVar13; local_c4 = local_c4 + 1) {
            in_stack_fffffffffffffd38 = (ostream *)(in_RDI + 0x1ce8);
            std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
                      ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                       (in_RDI + 0x1f38),(ulong)local_c4);
            AtomType::getName_abi_cxx11_
                      ((AtomType *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
            poVar9 = std::operator<<(in_stack_fffffffffffffd38,local_e8);
            std::operator<<(poVar9,"\t");
            std::__cxx11::string::~string(local_e8);
          }
          std::operator<<((ostream *)(in_RDI + 0x1ce8),")\t");
        }
      }
    }
    std::operator<<((ostream *)(in_RDI + 0x1ce8),'\n');
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (ulong)*(uint *)(in_RDI + 0x1c20);
    __rhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_111;
    std::allocator<int>::allocator((allocator<int> *)0x345000);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffd10,
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
               in_stack_fffffffffffffd00);
    std::allocator<int>::~allocator((allocator<int> *)0x345026);
    local_118 = 0;
    local_11c = 0;
    while( true ) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_11c;
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::bitset<9UL>::size((bitset<9UL> *)(in_RDI + 0x1ee8));
      if (pbVar14 <= __rhs) break;
      std::bitset<9UL>::operator[]
                ((bitset<9UL> *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                 (size_t)in_stack_fffffffffffffcf0);
      bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffcf0);
      in_stack_fffffffffffffd1c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd1c);
      std::bitset<9UL>::reference::~reference(&local_130);
      if ((in_stack_fffffffffffffd1c & 0x1000000) != 0) {
        for (local_134 = 0; local_134 < *(uint *)(in_RDI + 0x1c20); local_134 = local_134 + 1) {
          pvVar11 = std::
                    vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                    ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                  *)(in_RDI + 0x1f20),(ulong)local_11c);
          std::
          vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
          ::operator[](&pvVar11->accumulator,(ulong)local_134);
          pBVar12 = std::
                    unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                    ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                  *)0x34511f);
          iVar5 = (*pBVar12->_vptr_BaseAccumulator[8])();
          uVar6 = (uint)(CONCAT44(extraout_var_01,iVar5) != 0);
          pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(local_111 + 1),(ulong)local_134
                              );
          *pvVar15 = uVar6 + *pvVar15;
        }
        local_118 = local_118 + 1;
      }
      local_11c = local_11c + 1;
    }
    std::ios_base::precision
              ((ios_base *)(in_RDI + 0x1ce8 + *(long *)(*(long *)(in_RDI + 0x1ce8) + -0x18)),8);
    for (local_138 = 0; local_138 < *(uint *)(in_RDI + 0x1c20); local_138 = local_138 + 1) {
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(local_111 + 1),(ulong)local_138);
      if (*pvVar15 == local_118) {
        local_13c = 0;
        while( true ) {
          in_stack_fffffffffffffd00 = (allocator_type *)(ulong)local_13c;
          paVar16 = (allocator_type *)std::bitset<9UL>::size((bitset<9UL> *)(in_RDI + 0x1ee8));
          if (paVar16 <= in_stack_fffffffffffffd00) break;
          std::bitset<9UL>::operator[]
                    ((bitset<9UL> *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                     (size_t)in_stack_fffffffffffffcf0);
          in_stack_fffffffffffffcff =
               std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffcf0)
          ;
          std::bitset<9UL>::reference::~reference(&local_150);
          if ((in_stack_fffffffffffffcff & 1) != 0) {
            std::
            vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
            ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                          *)(in_RDI + 0x1f20),(ulong)local_13c);
            std::operator+((char *)in_stack_fffffffffffffd38,__rhs_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                           (char *)in_stack_fffffffffffffcf0);
            std::__cxx11::to_string(in_stack_fffffffffffffd1c);
            std::operator+(__lhs,__rhs);
            std::__cxx11::string::~string(local_1d0);
            std::__cxx11::string::~string(local_190);
            std::__cxx11::string::~string(local_1b0);
            pvVar11 = std::
                      vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                      ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                    *)(in_RDI + 0x1f20),(ulong)local_13c);
            std::
            vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
            ::operator[](&pvVar11->accumulator,(ulong)local_138);
            pBVar12 = std::
                      unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                      ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                    *)0x3453cd);
            (*pBVar12->_vptr_BaseAccumulator[9])(pBVar12,in_RDI + 0x1ce8,local_170,0);
            std::__cxx11::string::~string(local_170);
          }
          local_13c = local_13c + 1;
        }
        std::operator<<((ostream *)(in_RDI + 0x1ce8),'\n');
      }
    }
    std::operator<<((ostream *)(in_RDI + 0x1ce8),
                    "#######################################################\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),
                    "# 95% confidence intervals in those quantities follow:\n");
    std::operator<<((ostream *)(in_RDI + 0x1ce8),
                    "#######################################################\n");
    for (local_1d4 = 0; local_1d4 < *(uint *)(in_RDI + 0x1c20); local_1d4 = local_1d4 + 1) {
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(local_111 + 1),(ulong)local_1d4);
      if (*pvVar15 == local_118) {
        std::operator<<((ostream *)(in_RDI + 0x1ce8),"#");
        local_1d8 = 0;
        while( true ) {
          this_00 = (reference *)(ulong)local_1d8;
          prVar17 = (reference *)std::bitset<9UL>::size((bitset<9UL> *)(in_RDI + 0x1ee8));
          if (prVar17 <= this_00) break;
          std::bitset<9UL>::operator[]
                    ((bitset<9UL> *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                     (size_t)this_00);
          bVar3 = std::bitset::reference::operator_cast_to_bool(this_00);
          std::bitset<9UL>::reference::~reference(&local_1e8);
          if ((bVar3 & 1) != 0) {
            std::
            vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
            ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                          *)(in_RDI + 0x1f20),(ulong)local_1d8);
            std::operator+((char *)in_stack_fffffffffffffd38,__rhs_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                           (char *)this_00);
            std::__cxx11::to_string(in_stack_fffffffffffffd1c);
            std::operator+(__lhs,__rhs);
            std::__cxx11::string::~string(local_268);
            std::__cxx11::string::~string(local_228);
            std::__cxx11::string::~string(local_248);
            pvVar11 = std::
                      vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                      ::operator[]((vector<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                    *)(in_RDI + 0x1f20),(ulong)local_1d8);
            std::
            vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
            ::operator[](&pvVar11->accumulator,(ulong)local_1d4);
            pBVar12 = std::
                      unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                      ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                    *)0x34571c);
            (*pBVar12->_vptr_BaseAccumulator[10])(pBVar12,in_RDI + 0x1ce8,local_208,0);
            std::__cxx11::string::~string(local_208);
          }
          local_1d8 = local_1d8 + 1;
        }
        std::operator<<((ostream *)(in_RDI + 0x1ce8),'\n');
      }
    }
    std::ostream::flush();
    std::ofstream::close();
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
  }
  return;
}

Assistant:

void RNEMD::writeOutputFile() {
    if (!doRNEMD_) return;
    if (!hasData_) return;

#ifdef IS_MPI
    // If we're the primary node, should we print out the results
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    if (worldRank == 0) {
#endif
      rnemdFile_.open(rnemdFileName_.c_str(), std::ios::out | std::ios::trunc);

      if (!rnemdFile_) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Could not open \"%s\" for RNEMD output.\n",
                 rnemdFileName_.c_str());
        painCave.isFatal = 1;
        simError();
      }

      RealType time    = currentSnap_->getTime();
      RealType avgArea = areaAccumulator_.getAverage();

      RealType Jz(0.0);
      Vector3d JzP(V3Zero);
      Vector3d JzL(V3Zero);
      RealType Jpart(0.0);

      if (time >= info_->getSimParams()->getDt()) {
        Jz    = kineticExchange_ / (time * avgArea) / Constants::energyConvert;
        JzP   = momentumExchange_ / (time * avgArea);
        JzL   = angularMomentumExchange_ / (time * avgArea);
        Jpart = particleExchange_ / (time * avgArea);
      }

      rnemdFile_ << "#######################################################\n";
      rnemdFile_ << "# RNEMD {\n";
      rnemdFile_ << "#    exchangeMethod  = \"" << rnemdMethodLabel_ << "\";\n";
      rnemdFile_ << "#    fluxType  = \"" << rnemdFluxTypeLabel_ << "\";\n";

      if (usePeriodicBoundaryConditions_)
        rnemdFile_ << "#    privilegedAxis = " << rnemdAxisLabel_ << ";\n";

      rnemdFile_ << "#    exchangeTime = " << exchangeTime_ << ";\n";
      rnemdFile_ << "#    objectSelection = \"" << rnemdObjectSelection_
                 << "\";\n";
      rnemdFile_ << "#    selectionA = \"" << selectionA_ << "\";\n";
      rnemdFile_ << "#    selectionB = \"" << selectionB_ << "\";\n";
      rnemdFile_ << "#    outputSelection = \"" << outputSelection_ << "\";\n";
      rnemdFile_ << "# }\n";
      rnemdFile_ << "#######################################################\n";
      rnemdFile_ << "# RNEMD report:\n";
      rnemdFile_ << "#      running time = " << time << " fs\n";
      rnemdFile_ << "# Target flux:\n";
      rnemdFile_ << "#           kinetic = "
                 << kineticFlux_ / Constants::energyConvert
                 << " (kcal/mol/A^2/fs)\n";
      rnemdFile_ << "#          momentum = " << momentumFluxVector_
                 << " (amu/A/fs^2)\n";
      rnemdFile_ << "#  angular momentum = " << angularMomentumFluxVector_
                 << " (amu/A^2/fs^2)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << particleFlux_
                   << " (electrons/A^2/fs)\n";
      } else {
        rnemdFile_ << "#          particle = " << particleFlux_
                   << " (particles/A^2/fs)\n";
      }

      rnemdFile_ << "# Target one-time exchanges:\n";
      rnemdFile_ << "#          kinetic = "
                 << kineticTarget_ / Constants::energyConvert
                 << " (kcal/mol)\n";
      rnemdFile_ << "#          momentum = " << momentumTarget_
                 << " (amu*A/fs)\n";
      rnemdFile_ << "#  angular momentum = " << angularMomentumTarget_
                 << " (amu*A^2/fs)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << particleTarget_
                   << " (electrons)\n";
      } else {
        rnemdFile_ << "#          particle = " << particleTarget_
                   << " (particles)\n";
      }

      rnemdFile_ << "# Actual exchange totals:\n";
      rnemdFile_ << "#          kinetic = "
                 << kineticExchange_ / Constants::energyConvert
                 << " (kcal/mol)\n";
      rnemdFile_ << "#          momentum = " << momentumExchange_
                 << " (amu*A/fs)\n";
      rnemdFile_ << "#  angular momentum = " << angularMomentumExchange_
                 << " (amu*A^2/fs)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << particleExchange_
                   << " (electrons)\n";
      } else {
        rnemdFile_ << "#          particle = " << particleExchange_
                   << " (particles)\n";
      }

      rnemdFile_ << "# Actual flux:\n";
      rnemdFile_ << "#          kinetic = " << Jz << " (kcal/mol/A^2/fs)\n";
      rnemdFile_ << "#          momentum = " << JzP << " (amu/A/fs^2)\n";
      rnemdFile_ << "#  angular momentum = " << JzL << " (amu/A^2/fs^2)\n";
      if (useChargedSPF_) {
        rnemdFile_ << "#   current density = " << Jpart
                   << " (electrons/A^2/fs)\n";
      } else {
        rnemdFile_ << "#          particle = " << Jpart
                   << " (particles/A^2/fs)\n";
      }

      rnemdFile_ << "# Exchange statistics:\n";
      rnemdFile_ << "#               attempted = " << trialCount_ << "\n";
      rnemdFile_ << "#                  failed = " << failTrialCount_ << "\n";
      if (rnemdMethodLabel_ == "NIVS") {
        rnemdFile_ << "#  NIVS root-check errors = " << failRootCount_ << "\n";
      }
      rnemdFile_ << "#######################################################\n";

      // write title
      rnemdFile_ << "#";
      for (unsigned int i = 0; i < outputMask_.size(); ++i) {
        if (outputMask_[i]) {
          rnemdFile_ << "\t" << data_[i].title << "(" << data_[i].units << ")";

          // add some extra tabs for column alignment
          if (data_[i].accumulator[0]->getType() ==
              std::type_index(typeid(Vector3d))) {
            rnemdFile_ << "\t\t";
          }

          if (data_[i].accumulator[0]->getType() ==
              std::type_index(typeid(std::vector<RealType>))) {
            rnemdFile_ << "(";
            for (unsigned int type = 0; type < outputTypes_.size(); type++) {
              rnemdFile_ << outputTypes_[type]->getName() << "\t";
            }
            rnemdFile_ << ")\t";
          }
        }
      }

      rnemdFile_ << '\n';

      std::vector<int> nonEmptyAccumulators(nBins_);
      int numberOfAccumulators {};

      for (unsigned int i = 0; i < outputMask_.size(); ++i) {
        if (outputMask_[i]) {
          for (unsigned int bin = 0; bin < nBins_; bin++) {
            nonEmptyAccumulators[bin] +=
                static_cast<int>(data_[i].accumulator[bin]->getCount() != 0);
          }

          numberOfAccumulators++;
        }
      }

      rnemdFile_.precision(8);

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        if (nonEmptyAccumulators[bin] == numberOfAccumulators) {
          for (unsigned int i = 0; i < outputMask_.size(); ++i) {
            if (outputMask_[i]) {
              std::string message =
                  "RNEMD detected a numerical error writing: " +
                  data_[i].title + " for bin " + std::to_string(bin);

              data_[i].accumulator[bin]->writeData(rnemdFile_, message);
            }
          }

          rnemdFile_ << '\n';
        }
      }

      rnemdFile_ << "#######################################################\n";
      rnemdFile_ << "# 95% confidence intervals in those quantities follow:\n";
      rnemdFile_ << "#######################################################\n";

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        if (nonEmptyAccumulators[bin] == numberOfAccumulators) {
          rnemdFile_ << "#";

          for (unsigned int i = 0; i < outputMask_.size(); ++i) {
            if (outputMask_[i]) {
              std::string message =
                  "RNEMD detected a numerical error writing: " +
                  data_[i].title + " std. dev. for bin " + std::to_string(bin);

              data_[i].accumulator[bin]->writeErrorBars(rnemdFile_, message);
            }
          }

          rnemdFile_ << '\n';
        }
      }

      rnemdFile_.flush();
      rnemdFile_.close();
#ifdef IS_MPI
    }
#endif
  }

  void RNEMD::setKineticFlux(RealType kineticFlux) {
    // convert the kcal / mol / Angstroms^2 / fs values in the md file
    // into  amu / fs^3:
    kineticFlux_ = kineticFlux * Constants::energyConvert;
  }

  void RNEMD::setParticleFlux(RealType particleFlux) {
    RealType area = getDefaultDividingArea();

    particleFlux_   = particleFlux;
    particleTarget_ = particleFlux_ * exchangeTime_ * area;
  }

  void RNEMD::setMomentumFluxVector(
      const std::vector<RealType>& momentumFluxVector) {
    if (momentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "momentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               momentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    momentumFluxVector_.x() = momentumFluxVector[0];
    momentumFluxVector_.y() = momentumFluxVector[1];
    momentumFluxVector_.z() = momentumFluxVector[2];
  }

  void RNEMD::setAngularMomentumFluxVector(
      const std::vector<RealType>& angularMomentumFluxVector) {
    if (angularMomentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "angularMomentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               angularMomentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    angularMomentumFluxVector_.x() = angularMomentumFluxVector[0];
    angularMomentumFluxVector_.y() = angularMomentumFluxVector[1];
    angularMomentumFluxVector_.z() = angularMomentumFluxVector[2];
  }

  void RNEMD::parseOutputFileFormat(const std::string& format) {
    if (!doRNEMD_) return;
    StringTokenizer tokenizer(format, " ,;|\t\n\r");

    while (tokenizer.hasMoreTokens()) {
      std::string token(tokenizer.nextToken());
      toUpper(token);
      OutputMapType::iterator i = outputMap_.find(token);
      if (i != outputMap_.end()) {
        outputMask_.set(i->second);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::parseOutputFileFormat: %s is not a recognized\n"
                 "\toutputFileFormat keyword.\n",
                 token.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
    }
  }

  std::string RNEMD::setSelection(RealType& slabCenter) {
    bool printSlabCenterWarning {false};

    Vector3d tempSlabCenter {V3Zero};
    tempSlabCenter[rnemdPrivilegedAxis_] = slabCenter;

    RealType hmat_2 = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) / 2.0;

    if (slabCenter > hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    } else if (slabCenter < -hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    }

    if (printSlabCenterWarning) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "The given slab center was set to %0.2f. In the wrapped "
               "coordinates\n"
               "\t[-Hmat/2, +Hmat/2], this has been remapped to %0.2f.\n",
               slabCenter, tempSlabCenter[rnemdPrivilegedAxis_]);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();

      slabCenter = tempSlabCenter[rnemdPrivilegedAxis_];
    }

    Vector3d leftSlab {V3Zero};
    const RealType& leftSlabBoundary = leftSlab[rnemdPrivilegedAxis_];
    leftSlab[rnemdPrivilegedAxis_]   = slabCenter - 0.5 * slabWidth_;
    currentSnap_->wrapVector(leftSlab);

    Vector3d rightSlab {V3Zero};
    const RealType& rightSlabBoundary = rightSlab[rnemdPrivilegedAxis_];
    rightSlab[rnemdPrivilegedAxis_]   = slabCenter + 0.5 * slabWidth_;
    currentSnap_->wrapVector(rightSlab);

    std::ostringstream selectionStream;

    selectionStream << "select wrapped" << rnemdAxisLabel_
                    << " >= " << leftSlabBoundary;

    if (leftSlabBoundary > rightSlabBoundary)
      selectionStream << " || wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;
    else
      selectionStream << " && wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;

    return selectionStream.str();
  }

  RealType RNEMD::getDefaultDividingArea() {
    if (hasDividingArea_) return dividingArea_;

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (hasSelectionA_) {
      if (evaluatorA_.hasSurfaceArea()) {
        areaA_   = evaluatorA_.getSurfaceArea();
        volumeA_ = evaluatorA_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> aSites;
        seleManA_.setSelectionSet(evaluatorA_.evaluate());
        for (sd = seleManA_.beginSelected(isd); sd != NULL;
             sd = seleManA_.nextSelected(isd)) {
          aSites.push_back(sd);
        }
#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshA = new ConvexHull();
        surfaceMeshA->computeHull(aSites);
        areaA_   = surfaceMeshA->getArea();
        volumeA_ = surfaceMeshA->getVolume();
        delete surfaceMeshA;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaA_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaA_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaA_ = 2.0 * snap->getXYarea();
        }

        volumeA_ = areaA_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, the sphere radius sets the surface area of the
        // dividing surface:
        areaA_   = 4.0 * Constants::PI * std::pow(sphereARadius_, 2);
        volumeA_ = 4.0 * Constants::PI * std::pow(sphereARadius_, 3) / 3.0;
      }
    }

    if (hasSelectionB_) {
      if (evaluatorB_.hasSurfaceArea()) {
        areaB_   = evaluatorB_.getSurfaceArea();
        volumeB_ = evaluatorB_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> bSites;
        seleManB_.setSelectionSet(evaluatorB_.evaluate());
        for (sd = seleManB_.beginSelected(isd); sd != NULL;
             sd = seleManB_.nextSelected(isd)) {
          bSites.push_back(sd);
        }

#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshB = new ConvexHull();
        surfaceMeshB->computeHull(bSites);
        areaB_   = surfaceMeshB->getArea();
        volumeB_ = surfaceMeshB->getVolume();
        delete surfaceMeshB;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaB_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaB_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaB_ = 2.0 * snap->getXYarea();
        }

        volumeB_ = areaB_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, but if a sphereBradius has been set, just use that:
        areaB_ = 4.0 * Constants::PI * pow(sphereBRadius_, 2);
        Thermo thermo(info_);
        RealType hVol = thermo.getHullVolume();
        volumeB_ = hVol - 4.0 * Constants::PI * pow(sphereBRadius_, 3) / 3.0;
      }
    }

    dividingArea_    = min(areaA_, areaB_);
    hasDividingArea_ = true;
    return dividingArea_;
  }

  int RNEMD::getBin(Vector3d pos) {
    if (usePeriodicBoundaryConditions_) {
      currentSnap_->wrapVector(pos);

      return int(nBins_ *
                 (pos[rnemdPrivilegedAxis_] /
                      hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) +
                  0.5)) %
             nBins_;
    } else {
      Vector3d rPos = pos - coordinateOrigin_;
      return int(rPos.length() / binWidth_);
    }
  }
}